

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O0

void __thiscall Assimp::FindInstancesProcess::Execute(FindInstancesProcess *this,aiScene *pScene)

{
  aiMesh *in;
  unsigned_long uVar1;
  aiMesh *this_00;
  aiNode *node;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Logger *pLVar5;
  unsigned_long *__p;
  uint *puVar6;
  uint64_t uVar7;
  type puVar8;
  type puVar9;
  pointer puVar10;
  pointer __s2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  ai_real aVar11;
  float e;
  uint local_244;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_c8;
  uint local_a8;
  uint local_a4;
  uint i_1;
  uint real;
  aiFace *paStack_98;
  uint nn_1;
  aiFace *f2;
  aiFace *paStack_88;
  uint nn;
  aiFace *f;
  uint tt;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> ftbl_inst;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> ftbl_orig;
  uint end_1;
  uint j_1;
  uint end;
  uint j;
  aiMesh *orig;
  int a;
  float epsilon;
  aiMesh *inst;
  uint local_38;
  uint i;
  uint numMeshesOut;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> local_28;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> remapping;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> hashes;
  aiScene *pScene_local;
  FindInstancesProcess *this_local;
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"FindInstancesProcess begin");
  if (pScene->mNumMeshes != 0) {
    __p = (unsigned_long *)operator_new__((ulong)pScene->mNumMeshes << 3);
    std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
    unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
              ((unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>> *)&remapping,__p);
    puVar6 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
    std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
    unique_ptr<unsigned_int*,std::default_delete<unsigned_int[]>,void,bool>
              ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&local_28,puVar6);
    local_38 = 0;
    for (inst._4_4_ = 0; inst._4_4_ < pScene->mNumMeshes; inst._4_4_ = inst._4_4_ + 1) {
      in = pScene->mMeshes[inst._4_4_];
      uVar7 = GetMeshHash(in);
      puVar8 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                         ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                          &remapping,(ulong)inst._4_4_);
      *puVar8 = uVar7;
      aVar11 = ComputePositionEpsilon(in);
      e = aVar11 * aVar11;
      orig._0_4_ = inst._4_4_;
      do {
        do {
          do {
            do {
              do {
                orig._0_4_ = (uint)orig - 1;
                if ((int)(uint)orig < 0) goto LAB_005b5d98;
                puVar8 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::
                         operator[]((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                     *)&remapping,(ulong)inst._4_4_);
                uVar1 = *puVar8;
                puVar8 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::
                         operator[]((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                     *)&remapping,(long)(int)(uint)orig);
              } while ((((((((uVar1 != *puVar8) ||
                            (this_00 = pScene->mMeshes[(int)(uint)orig], this_00 == (aiMesh *)0x0))
                           || (this_00->mNumBones != in->mNumBones)) ||
                          ((this_00->mNumFaces != in->mNumFaces ||
                           (this_00->mNumVertices != in->mNumVertices)))) ||
                         ((this_00->mMaterialIndex != in->mMaterialIndex ||
                          (this_00->mPrimitiveTypes != in->mPrimitiveTypes)))) ||
                        ((bVar2 = aiMesh::HasPositions(this_00), bVar2 &&
                         (bVar2 = CompareArrays(this_00->mVertices,in->mVertices,
                                                this_00->mNumVertices,e), !bVar2)))) ||
                       ((bVar2 = aiMesh::HasNormals(this_00), bVar2 &&
                        (bVar2 = CompareArrays(this_00->mNormals,in->mNormals,this_00->mNumVertices,
                                               e), !bVar2)))) ||
                      ((bVar2 = aiMesh::HasTangentsAndBitangents(this_00), bVar2 &&
                       ((bVar2 = CompareArrays(this_00->mTangents,in->mTangents,
                                               this_00->mNumVertices,e), !bVar2 ||
                        (bVar2 = CompareArrays(this_00->mBitangents,in->mBitangents,
                                               this_00->mNumVertices,e), !bVar2))))));
              uVar3 = aiMesh::GetNumUVChannels(this_00);
              j_1 = 0;
              while ((j_1 < uVar3 &&
                     ((this_00->mTextureCoords[j_1] == (aiVector3D *)0x0 ||
                      (bVar2 = CompareArrays(this_00->mTextureCoords[j_1],in->mTextureCoords[j_1],
                                             this_00->mNumVertices,0.001), bVar2))))) {
                j_1 = j_1 + 1;
              }
            } while (j_1 != uVar3);
            uVar3 = aiMesh::GetNumColorChannels(this_00);
            ftbl_orig._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
            ._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ = 0;
            while ((ftbl_orig._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ < uVar3 &&
                   ((this_00->mColors
                     [ftbl_orig._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_] ==
                     (aiColor4D *)0x0 ||
                    (bVar2 = CompareArrays(this_00->mColors
                                           [ftbl_orig._M_t.
                                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                            .super__Head_base<0UL,_unsigned_int_*,_false>.
                                            _M_head_impl._4_4_],
                                           in->mColors
                                           [ftbl_orig._M_t.
                                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                            .super__Head_base<0UL,_unsigned_int_*,_false>.
                                            _M_head_impl._4_4_],this_00->mNumVertices,0.001), bVar2)
                    )))) {
              ftbl_orig._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ =
                   ftbl_orig._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ + 1;
            }
          } while (ftbl_orig._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ != uVar3);
          if ((this->configSpeedFlag & 1U) != 0) goto LAB_005b5cfa;
          bVar2 = CompareBones(this_00,in);
        } while (!bVar2);
        puVar6 = (uint *)operator_new__((ulong)this_00->mNumVertices << 2);
        std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
        unique_ptr<unsigned_int*,std::default_delete<unsigned_int[]>,void,bool>
                  ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&ftbl_inst,
                   puVar6);
        puVar6 = (uint *)operator_new__((ulong)this_00->mNumVertices << 2);
        std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
        unique_ptr<unsigned_int*,std::default_delete<unsigned_int[]>,void,bool>
                  ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)
                   &stack0xffffffffffffff88,puVar6);
        for (f._4_4_ = 0; f._4_4_ < this_00->mNumFaces; f._4_4_ = f._4_4_ + 1) {
          paStack_88 = this_00->mFaces + f._4_4_;
          for (f2._4_4_ = 0; uVar3 = f._4_4_, f2._4_4_ < paStack_88->mNumIndices;
              f2._4_4_ = f2._4_4_ + 1) {
            puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[](&ftbl_inst,(ulong)paStack_88->mIndices[f2._4_4_]);
            *puVar9 = uVar3;
          }
          paStack_98 = in->mFaces + f._4_4_;
          for (real = 0; uVar3 = f._4_4_, real < paStack_98->mNumIndices; real = real + 1) {
            puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                                &stack0xffffffffffffff88,(ulong)paStack_98->mIndices[real]);
            *puVar9 = uVar3;
          }
        }
        puVar10 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                             &stack0xffffffffffffff88);
        __s2 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                         (&ftbl_inst);
        iVar4 = memcmp(puVar10,__s2,(ulong)this_00->mNumVertices << 2);
        if (iVar4 == 0) {
          i_1 = 0;
        }
        else {
          i_1 = 7;
        }
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                   &stack0xffffffffffffff88);
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  (&ftbl_inst);
      } while (i_1 != 0);
LAB_005b5cfa:
      puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                         (&local_28,(long)(int)(uint)orig);
      uVar3 = *puVar9;
      puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                         (&local_28,(ulong)inst._4_4_);
      *puVar9 = uVar3;
      if (in != (aiMesh *)0x0) {
        aiMesh::~aiMesh(in);
        operator_delete(in,0x520);
      }
      pScene->mMeshes[inst._4_4_] = (aiMesh *)0x0;
LAB_005b5d98:
      if (pScene->mMeshes[inst._4_4_] != (aiMesh *)0x0) {
        puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                           (&local_28,(ulong)inst._4_4_);
        *puVar9 = local_38;
        local_38 = local_38 + 1;
      }
    }
    if (local_38 == 0) {
      __assert_fail("0 != numMeshesOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FindInstancesProcess.cpp"
                    ,0x100,"virtual void Assimp::FindInstancesProcess::Execute(aiScene *)");
    }
    if (local_38 == pScene->mNumMeshes) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"FindInstancesProcess finished. No instanced meshes found");
    }
    else {
      local_a4 = 0;
      local_a8 = 0;
      while (local_a4 < local_38) {
        if (pScene->mMeshes[local_a8] != (aiMesh *)0x0) {
          pScene->mMeshes[local_a4] = pScene->mMeshes[local_a8];
          local_a4 = local_a4 + 1;
        }
        local_a8 = local_a8 + 1;
      }
      node = pScene->mRootNode;
      puVar10 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                          (&local_28);
      UpdateMeshIndices(node,puVar10);
      bVar2 = DefaultLogger::isNullLogger();
      if (!bVar2) {
        pLVar5 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[38]>(&local_240,(char (*) [38])"FindInstancesProcess finished. Found ")
        ;
        local_244 = pScene->mNumMeshes - local_38;
        this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_240,&local_244);
        this_02 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(this_01,(char (*) [11])" instances");
        Formatter::basic_formatter::operator_cast_to_string(&local_c8,this_02);
        Logger::info(pLVar5,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_240);
      }
      pScene->mNumMeshes = local_38;
    }
    std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&local_28);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&remapping);
  }
  return;
}

Assistant:

void FindInstancesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FindInstancesProcess begin");
    if (pScene->mNumMeshes) {

        // use a pseudo hash for all meshes in the scene to quickly find
        // the ones which are possibly equal. This step is executed early
        // in the pipeline, so we could, depending on the file format,
        // have several thousand small meshes. That's too much for a brute
        // everyone-against-everyone check involving up to 10 comparisons
        // each.
        std::unique_ptr<uint64_t[]> hashes (new uint64_t[pScene->mNumMeshes]);
        std::unique_ptr<unsigned int[]> remapping (new unsigned int[pScene->mNumMeshes]);

        unsigned int numMeshesOut = 0;
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

            aiMesh* inst = pScene->mMeshes[i];
            hashes[i] = GetMeshHash(inst);

            // Find an appropriate epsilon 
            // to compare position differences against
            float epsilon = ComputePositionEpsilon(inst);
            epsilon *= epsilon;

            for (int a = i-1; a >= 0; --a) {
                if (hashes[i] == hashes[a])
                {
                    aiMesh* orig = pScene->mMeshes[a];
                    if (!orig)
                        continue;

                    // check for hash collision .. we needn't check
                    // the vertex format, it *must* match due to the
                    // (brilliant) construction of the hash
                    if (orig->mNumBones       != inst->mNumBones      ||
                        orig->mNumFaces       != inst->mNumFaces      ||
                        orig->mNumVertices    != inst->mNumVertices   ||
                        orig->mMaterialIndex  != inst->mMaterialIndex ||
                        orig->mPrimitiveTypes != inst->mPrimitiveTypes)
                        continue;

                    // up to now the meshes are equal. Now compare vertex positions, normals,
                    // tangents and bitangents using this epsilon.
                    if (orig->HasPositions()) {
                        if(!CompareArrays(orig->mVertices,inst->mVertices,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasNormals()) {
                        if(!CompareArrays(orig->mNormals,inst->mNormals,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasTangentsAndBitangents()) {
                        if (!CompareArrays(orig->mTangents,inst->mTangents,orig->mNumVertices,epsilon) ||
                            !CompareArrays(orig->mBitangents,inst->mBitangents,orig->mNumVertices,epsilon))
                            continue;
                    }

                    // use a constant epsilon for colors and UV coordinates
                    static const float uvEpsilon = 10e-4f;
                    {
                        unsigned int j, end = orig->GetNumUVChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mTextureCoords[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mTextureCoords[j],inst->mTextureCoords[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }
                    {
                        unsigned int j, end = orig->GetNumColorChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mColors[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mColors[j],inst->mColors[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }

                    // These two checks are actually quite expensive and almost *never* required.
                    // Almost. That's why they're still here. But there's no reason to do them
                    // in speed-targeted imports.
                    if (!configSpeedFlag) {

                        // It seems to be strange, but we really need to check whether the
                        // bones are identical too. Although it's extremely unprobable
                        // that they're not if control reaches here, we need to deal
                        // with unprobable cases, too. It could still be that there are
                        // equal shapes which are deformed differently.
                        if (!CompareBones(orig,inst))
                            continue;

                        // For completeness ... compare even the index buffers for equality
                        // face order & winding order doesn't care. Input data is in verbose format.
                        std::unique_ptr<unsigned int[]> ftbl_orig(new unsigned int[orig->mNumVertices]);
                        std::unique_ptr<unsigned int[]> ftbl_inst(new unsigned int[orig->mNumVertices]);

                        for (unsigned int tt = 0; tt < orig->mNumFaces;++tt) {
                            aiFace& f = orig->mFaces[tt];
                            for (unsigned int nn = 0; nn < f.mNumIndices;++nn)
                                ftbl_orig[f.mIndices[nn]] = tt;

                            aiFace& f2 = inst->mFaces[tt];
                            for (unsigned int nn = 0; nn < f2.mNumIndices;++nn)
                                ftbl_inst[f2.mIndices[nn]] = tt;
                        }
                        if (0 != ::memcmp(ftbl_inst.get(),ftbl_orig.get(),orig->mNumVertices*sizeof(unsigned int)))
                            continue;
                    }

                    // We're still here. Or in other words: 'inst' is an instance of 'orig'.
                    // Place a marker in our list that we can easily update mesh indices.
                    remapping[i] = remapping[a];

                    // Delete the instanced mesh, we don't need it anymore
                    delete inst;
                    pScene->mMeshes[i] = NULL;
                    break;
                }
            }

            // If we didn't find a match for the current mesh: keep it
            if (pScene->mMeshes[i]) {
                remapping[i] = numMeshesOut++;
            }
        }
        ai_assert(0 != numMeshesOut);
        if (numMeshesOut != pScene->mNumMeshes) {

            // Collapse the meshes array by removing all NULL entries
            for (unsigned int real = 0, i = 0; real < numMeshesOut; ++i) {
                if (pScene->mMeshes[i])
                    pScene->mMeshes[real++] = pScene->mMeshes[i];
            }

            // And update the node graph with our nice lookup table
            UpdateMeshIndices(pScene->mRootNode,remapping.get());

            // write to log
            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_INFO_F( "FindInstancesProcess finished. Found ", (pScene->mNumMeshes - numMeshesOut), " instances" );
            }
            pScene->mNumMeshes = numMeshesOut;
        } else {
            ASSIMP_LOG_DEBUG("FindInstancesProcess finished. No instanced meshes found");
        }
    }
}